

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source.cc
# Opt level: O2

MaskImage * __thiscall
DataSourceBase::separate_sprites
          (MaskImage *__return_storage_ptr__,DataSourceBase *this,PSprite *s1,PSprite *s2)

{
  element_type *peVar1;
  PSprite filled;
  PSprite masked;
  __shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2> _Stack_88;
  __shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  peVar1 = (s1->super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((peVar1 == (element_type *)0x0) ||
     ((s2->super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0)) {
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_>).
    super__Head_base<0UL,_std::shared_ptr<Data::Sprite>,_false>._M_head_impl.
    super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_>).
    super__Head_base<0UL,_std::shared_ptr<Data::Sprite>,_false>._M_head_impl.
    super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_>).
    super__Tuple_impl<1UL,_std::shared_ptr<Data::Sprite>_>.
    super__Head_base<1UL,_std::shared_ptr<Data::Sprite>,_false>._M_head_impl.
    super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->
    super__Tuple_impl<0UL,_std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_>).
    super__Tuple_impl<1UL,_std::shared_ptr<Data::Sprite>_>.
    super__Head_base<1UL,_std::shared_ptr<Data::Sprite>,_false>._M_head_impl.
    super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    std::__shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_38,&s2->super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>);
    (*peVar1->_vptr_Sprite[8])(&_Stack_88,peVar1,&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
    peVar1 = (s1->super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_48,&_Stack_88);
    (*peVar1->_vptr_Sprite[7])(&local_78,peVar1,&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    (*(local_78._M_ptr)->_vptr_Sprite[0xe])();
    peVar1 = (s1->super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_58,&_Stack_88);
    (*peVar1->_vptr_Sprite[0xc])(peVar1,&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    peVar1 = (s1->super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_68,&local_78);
    (*peVar1->_vptr_Sprite[0xf])(peVar1,&local_68,0,0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
    std::tuple<std::shared_ptr<Data::Sprite>,_std::shared_ptr<Data::Sprite>_>::
    tuple<std::shared_ptr<Data::Sprite>_&,_std::shared_ptr<Data::Sprite>_&,_true>
              (__return_storage_ptr__,(shared_ptr<Data::Sprite> *)&_Stack_88,s1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_88._M_refcount);
  }
  return __return_storage_ptr__;
}

Assistant:

Data::MaskImage
DataSourceBase::separate_sprites(Data::PSprite s1, Data::PSprite s2) {
  if (!s1 || !s2) {
    return std::make_tuple(nullptr, nullptr);
  }

  Data::PSprite filled = s1->create_mask(s2);
  Data::PSprite masked = s1->get_masked(filled);
  masked->make_alpha_mask();
  s1->del(filled);
  s1->stick(masked, 0, 0);

  return std::make_tuple(filled, s1);
}